

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rbuVfsWrite(sqlite3_file *pFile,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  sqlite3_io_methods *psVar1;
  uint uVar2;
  int iVar3;
  u32 uVar4;
  u8 *pBuf;
  
  psVar1 = pFile[3].pMethods;
  if (psVar1 != (sqlite3_io_methods *)0x0) {
    if (psVar1->iVersion == 1) {
      uVar2 = *(uint *)&pFile[5].pMethods;
      if (((uVar2 >> 0x13 & 1) != 0) && ((long)psVar1[1].xShmBarrier <= iOfst)) {
        psVar1[1].xShmBarrier = (_func_void_sqlite3_file_ptr *)(iAmt + iOfst);
        goto LAB_001b83a4;
      }
    }
    else {
      if (psVar1->iVersion == 3) {
        *(int *)(*(long *)(psVar1 + 2) + -8 + (long)*(int *)&psVar1[1].xUnfetch * 8) =
             (int)(iOfst / (long)*(int *)&psVar1[2].xClose) + 1;
        return 0;
      }
      uVar2 = *(uint *)&pFile[5].pMethods;
    }
    if ((((uVar2 & 8) != 0) && ((long)pFile[4].pMethods < iAmt + iOfst)) &&
       (iVar3 = rbuUpdateTempSize((rbu_file *)pFile,iAmt + iOfst), iVar3 != 0)) {
      return iVar3;
    }
  }
LAB_001b83a4:
  iVar3 = (**(code **)(*(long *)pFile[1].pMethods + 0x18))(pFile[1].pMethods,zBuf,iAmt,iOfst);
  if ((iOfst == 0 && iVar3 == 0) && (iVar3 = 0, ((ulong)pFile[5].pMethods & 0x100) != 0)) {
    uVar4 = rbuGetU32((u8 *)((long)zBuf + 0x18));
    *(u32 *)((long)&pFile[5].pMethods + 4) = uVar4;
    *(undefined1 *)&pFile[6].pMethods = *(undefined1 *)((long)zBuf + 0x13);
  }
  return iVar3;
}

Assistant:

static int rbuVfsWrite(
  sqlite3_file *pFile, 
  const void *zBuf, 
  int iAmt, 
  sqlite_int64 iOfst
){
  rbu_file *p = (rbu_file*)pFile;
  sqlite3rbu *pRbu = p->pRbu;
  int rc;

  if( pRbu && pRbu->eStage==RBU_STAGE_CAPTURE ){
    assert( p->openFlags & SQLITE_OPEN_MAIN_DB );
    rc = rbuCaptureDbWrite(p->pRbu, iOfst);
  }else{
    if( pRbu ){
      if( pRbu->eStage==RBU_STAGE_OAL 
       && (p->openFlags & SQLITE_OPEN_WAL) 
       && iOfst>=pRbu->iOalSz
      ){
        pRbu->iOalSz = iAmt + iOfst;
      }else if( p->openFlags & SQLITE_OPEN_DELETEONCLOSE ){
        i64 szNew = iAmt+iOfst;
        if( szNew>p->sz ){
          rc = rbuUpdateTempSize(p, szNew);
          if( rc!=SQLITE_OK ) return rc;
        }
      }
    }
    rc = p->pReal->pMethods->xWrite(p->pReal, zBuf, iAmt, iOfst);
    if( rc==SQLITE_OK && iOfst==0 && (p->openFlags & SQLITE_OPEN_MAIN_DB) ){
      /* These look like magic numbers. But they are stable, as they are part
      ** of the definition of the SQLite file format, which may not change. */
      u8 *pBuf = (u8*)zBuf;
      p->iCookie = rbuGetU32(&pBuf[24]);
      p->iWriteVer = pBuf[19];
    }
  }
  return rc;
}